

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_explain.hpp
# Opt level: O2

void __thiscall
duckdb::LogicalExplain::LogicalExplain
          (LogicalExplain *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,ExplainType explain_type,ExplainFormat explain_format)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_EXPLAIN);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalExplain_027c1168;
  (this->super_LogicalOperator).field_0x61 = explain_type;
  (this->super_LogicalOperator).field_0x62 = explain_format;
  (this->physical_plan)._M_dataplus._M_p = (pointer)&(this->physical_plan).field_2;
  (this->physical_plan)._M_string_length = 0;
  (this->physical_plan).field_2._M_local_buf[0] = '\0';
  (this->logical_plan_unopt)._M_dataplus._M_p = (pointer)&(this->logical_plan_unopt).field_2;
  (this->logical_plan_unopt)._M_string_length = 0;
  (this->logical_plan_unopt).field_2._M_local_buf[0] = '\0';
  (this->logical_plan_opt)._M_dataplus._M_p = (pointer)&(this->logical_plan_opt).field_2;
  (this->logical_plan_opt)._M_string_length = 0;
  (this->logical_plan_opt).field_2._M_local_buf[0] = '\0';
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(this->super_LogicalOperator).children,plan);
  return;
}

Assistant:

LogicalExplain(unique_ptr<LogicalOperator> plan, ExplainType explain_type, ExplainFormat explain_format)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPLAIN), explain_type(explain_type),
	      explain_format(explain_format) {
		children.push_back(std::move(plan));
	}